

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

QByteArray *
formatConnectionSignature(QByteArray *__return_storage_ptr__,char *className,QMetaMethod *method)

{
  bool bVar1;
  uint uVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_100;
  QArrayDataPointer<char> local_e8;
  QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray> local_d0;
  QArrayDataPointer<char> local_98;
  QStringBuilder<const_char_(&)[11],_QByteArray> local_78;
  QArrayDataPointer<char> local_58;
  char *className_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  className_local = className;
  QMetaMethod::methodSignature((QByteArray *)&local_58,method);
  qVar3 = QByteArray::indexOf((QByteArray *)&local_58,'(',0);
  uVar2 = (uint)qVar3;
  bVar1 = (long)(ulong)(uVar2 & 0x7fffffff) < (long)(local_58.size + -2);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (-1 < (int)uVar2 && bVar1) {
    QByteArray::mid((QByteArray *)&local_98,(QByteArray *)&local_58,(long)(int)(uVar2 + 1),
                    (qsizetype)(local_58.size + (-2 - (long)(int)uVar2)));
    local_78.b.d.size = local_98.size;
    local_78.b.d.ptr = local_98.ptr;
    local_78.b.d.d = local_98.d;
    local_78.a = (char (*) [11])0x47030a;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char *)0x0;
    local_98.size = 0;
    QStringBuilder<const_char_(&)[11],_QByteArray>::QStringBuilder
              ((QStringBuilder<const_char_(&)[11],_QByteArray> *)&local_d0,&local_78);
    local_d0.b.d.d = (Data *)0x470315;
    operator+=(__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[3]> *)
               &local_d0);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_d0.a.b.d);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78.b.d);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  }
  QByteArray::append(__return_storage_ptr__,'&');
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (char *)0x0;
  local_e8.size = 0;
  local_78.a = (char (*) [11])&className_local;
  local_98.d = (Data *)0x0;
  local_78.b.d.d = (Data *)0x0;
  local_98.ptr = (char *)0x0;
  local_98.size = 0;
  local_78.b.d.ptr = "::";
  local_78.b.d.size = 2;
  QMetaMethod::name((QByteArray *)&local_100,method);
  QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray>::QStringBuilder
            (&local_d0,(QStringBuilder<const_char_*&,_QByteArray> *)&local_78,
             (QByteArray *)&local_100);
  operator+=(__return_storage_ptr__,&local_d0);
  QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray>::~QStringBuilder(&local_d0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_100);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
  if (-1 < (int)uVar2 && bVar1) {
    QByteArray::append(__return_storage_ptr__,')');
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray formatConnectionSignature(const char *className, const QMetaMethod &method)
{
    const auto signature = method.methodSignature();
    Q_ASSERT(signature.endsWith(')'));
    const int openParen = signature.indexOf('(');
    const bool hasParameters = openParen >= 0 && openParen < signature.size() - 2;
    QByteArray result;
    if (hasParameters) {
        result += "qOverload<"
            + signature.mid(openParen + 1, signature.size() - openParen - 2) + ">(";
    }
    result += '&';
    result += className + QByteArrayLiteral("::") + method.name();
    if (hasParameters)
        result += ')';
    return result;
}